

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

int Path::rmdir(char *__path)

{
  char *__s1;
  long lVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  char *__s;
  ulong __maxlen;
  stat statbuf;
  StackBuffer<4096UL,_char> buffer;
  String local_10f0;
  stat local_10d0;
  char local_1040 [4096];
  char *local_40;
  ulong local_38;
  
  __dirp = opendir(*(char **)__path);
  if (__dirp != (DIR *)0x0) {
    lVar1 = *(long *)(__path + 8);
    do {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) break;
      __s1 = pdVar3->d_name;
      iVar2 = strcmp(__s1,".");
      if (iVar2 != 0) {
        iVar2 = strcmp(__s1,"..");
        if (iVar2 != 0) {
          sVar4 = strlen(__s1);
          __maxlen = sVar4 + lVar1 + 2;
          local_40 = (char *)0x0;
          __s = local_1040;
          local_38 = __maxlen;
          if (0x1000 < __maxlen) {
            __s = (char *)operator_new__(__maxlen);
          }
          local_40 = __s;
          snprintf(__s,__maxlen,"%s/%s",*(undefined8 *)__path,__s1);
          iVar2 = ::stat(local_40,&local_10d0);
          if (iVar2 == 0) {
            if ((local_10d0.st_mode & 0xf000) == 0x4000) {
              String::String(&local_10f0,local_40,0xffffffffffffffff);
              rmdir((char *)&local_10f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_10f0.mString._M_dataplus._M_p != &local_10f0.mString.field_2) {
                operator_delete(local_10f0.mString._M_dataplus._M_p);
              }
            }
            else {
              unlink(local_40);
            }
          }
          if ((0x1000 < local_38) && (local_40 != (char *)0x0)) {
            operator_delete__(local_40);
          }
        }
      }
    } while (pdVar3 != (dirent *)0x0);
    closedir(__dirp);
  }
  iVar2 = ::rmdir(*(char **)__path);
  return CONCAT31((int3)((uint)iVar2 >> 8),iVar2 == 0);
}

Assistant:

bool Path::rmdir(const Path &dir)
{
#ifdef _WIN32
    // SHFileOperation needs an absolute path.
    Path absDir = Path::resolved(dir, MakeAbsolute);
    std::wstring pathU16 = Utf8To16(dir.c_str());

    // double zero terminate the string. There *should* already be one zero
    // in c_str(), but better to be safe.
    pathU16.append(2, 0);

    // Deletion through SHFileOperation is recursive.
    SHFILEOPSTRUCTW op;
    memset(&op, 0, sizeof(SHFILEOPSTRUCTW));
    op.wFunc = FO_DELETE;
    op.pFrom = pathU16.c_str();
    op.fFlags = FOF_NO_UI;
    bool ret = (SHFileOperationW(&op) == 0);
    return ret;

#else
    DIR *d = opendir(dir.constData());
    size_t path_len = dir.size();
    union {
        char buf[PATH_MAX];
        dirent dbuf;
    };

    if (d) {
        while (dirent *p = readdir(d)) {
            /* Skip the names "." and ".." as we don't want to recurse on them. */
            if (!strcmp(p->d_name, ".") || !strcmp(p->d_name, "..")) {
                continue;
            }

            const size_t len = path_len + strlen(p->d_name) + 2;
            StackBuffer<PATH_MAX> buffer(len);

            if (buffer) {
                struct stat statbuf;
                snprintf(buffer, len, "%s/%s", dir.constData(), p->d_name);
                if (!::stat(buffer, &statbuf)) {
                    if (S_ISDIR(statbuf.st_mode)) {
                        Path::rmdir(Path(buffer));
                    } else {
                        unlink(buffer);
                    }
                }
            }
        }
        closedir(d);
    }
    return ::rmdir(dir.constData()) == 0;
#endif
}